

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputerPlayer.cpp
# Opt level: O0

Card * __thiscall ComputerPlayer::greatestOnTable(ComputerPlayer *this)

{
  Card *this_00;
  Card *rhs;
  bool bVar1;
  reference ppCVar2;
  Deal *this_01;
  Contract *c;
  __normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> local_30;
  Card *local_28;
  Card *tmp;
  Card *greatest;
  iterator iter;
  ComputerPlayer *this_local;
  
  iter._M_current = (Card **)this;
  greatest = (Card *)std::vector<Card_*,_std::allocator<Card_*>_>::begin(&this->cardsOnTable);
  ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
            operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                      &greatest);
  tmp = *ppCVar2;
  ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
            operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                      &greatest);
  local_28 = *ppCVar2;
  __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
            ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)&greatest)
  ;
  while( true ) {
    local_30._M_current =
         (Card **)std::vector<Card_*,_std::allocator<Card_*>_>::end(&this->cardsOnTable);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
                       &greatest,&local_30);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
              operator*((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *
                        )&greatest);
    rhs = tmp;
    this_00 = *ppCVar2;
    local_28 = this_00;
    this_01 = Game::getCurrentDeal((this->super_Player)._game);
    c = Deal::getContract(this_01);
    bVar1 = Card::isBigger(this_00,rhs,c);
    if (bVar1) {
      tmp = local_28;
    }
    __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
              ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_> *)
               &greatest);
  }
  return tmp;
}

Assistant:

Card *ComputerPlayer::greatestOnTable() {
    vector<Card *>::iterator iter = cardsOnTable.begin();
    Card *greatest = *iter;

    //greatest Card on the table
    Card *tmp = *iter;
    for (++iter; iter != cardsOnTable.end(); ++iter) {
        tmp = *iter;
        if (tmp->isBigger(greatest, _game->getCurrentDeal()->getContract()))
            greatest = tmp;

        //std::cout << ' ' << greatest->getValue() << '\n';
    }

    return greatest;
}